

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
::SetArray(ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
           *this,IDeviceObject **ppObjects,Uint32 FirstElement,Uint32 NumElements,
          SET_SHADER_RESOURCE_FLAGS Flags)

{
  PipelineResourceDesc *Args;
  ulong uVar1;
  uint *Args_7;
  Uint32 FirstElement_local;
  SET_SHADER_RESOURCE_FLAGS local_5c;
  string msg;
  int local_38;
  int local_34;
  
  Args_7 = (uint *)0x233a37;
  FirstElement_local = FirstElement;
  local_5c = Flags;
  Args = GetDesc(this);
  if (Args->ArraySize < FirstElement + NumElements) {
    local_34 = (FirstElement + NumElements) - 1;
    local_38 = Args->ArraySize - 1;
    FormatString<char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
              (&msg,(Diligent *)"SetArray arguments are invalid for \'",(char (*) [37])Args,
               (char **)"\' variable: specified element range (",(char (*) [38])&FirstElement_local,
               (uint *)0x6e1af8,(char (*) [5])&local_34,(uint *)") is out of array bounds 0 .. ",
               (char (*) [31])&local_38,Args_7);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2ab);
    std::__cxx11::string::~string((string *)&msg);
  }
  for (uVar1 = 0; NumElements != uVar1; uVar1 = uVar1 + 1) {
    msg._M_string_length._4_4_ = FirstElement_local + (int)uVar1;
    msg._M_dataplus._M_p = (pointer)ppObjects[uVar1];
    msg._M_string_length._0_4_ = local_5c;
    msg.field_2._M_allocated_capacity = 0;
    msg.field_2._8_8_ = 0;
    ShaderVariableVkImpl::BindResource((ShaderVariableVkImpl *)this,(BindResourceInfo *)&msg);
  }
  return;
}

Assistant:

SetArray(IDeviceObject* const*     ppObjects,
                                             Uint32                    FirstElement,
                                             Uint32                    NumElements,
                                             SET_SHADER_RESOURCE_FLAGS Flags) override final
    {
        const PipelineResourceDesc& Desc = GetDesc();

        DEV_CHECK_ERR(FirstElement + NumElements <= Desc.ArraySize,
                      "SetArray arguments are invalid for '", Desc.Name, "' variable: specified element range (", FirstElement, " .. ",
                      FirstElement + NumElements - 1, ") is out of array bounds 0 .. ", Desc.ArraySize - 1);

        for (Uint32 elem = 0; elem < NumElements; ++elem)
            static_cast<ThisImplType*>(this)->BindResource(BindResourceInfo{FirstElement + elem, ppObjects[elem], Flags});
    }